

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

void __thiscall BN::BN(BN *this,string *str,RadixBN radix)

{
  char cVar1;
  byte bVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer puVar5;
  invalid_argument *this_00;
  long lVar6;
  long lVar7;
  size_type sVar8;
  long lVar9;
  short sVar10;
  allocator local_99;
  BN *local_98;
  BN bn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = this;
  if (radix == dec) {
    BN(&bn,1,1);
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar4 = str->_M_string_length;
    for (sVar8 = 0; sVar4 != sVar8; sVar8 = sVar8 + 1) {
      cVar1 = pcVar3[sVar8];
      if (0xf5 < (byte)(cVar1 - 0x3aU)) {
        local_70._M_dataplus._M_p._0_2_ = 10;
        mulbaseappr(&bn,(bt *)&local_70);
        BN((BN *)&local_70,(ulong)(byte)(cVar1 - 0x30));
        operator+=(&bn,(BN *)&local_70);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_70);
      }
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign
              (&local_98->ba,(_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&bn);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&bn);
    return;
  }
  sVar4 = str->_M_string_length;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,sVar4 + 3 >> 2);
  puVar5 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  lVar6 = (lVar9 >> 1) + -1;
  lVar9 = sVar4 + lVar9 * -2 + 4;
  pcVar3 = (str->_M_dataplus)._M_p;
  sVar8 = 0;
  while( true ) {
    if (sVar4 == sVar8) {
      anon_unknown.dwarf_1add5::Norm(&this->ba);
      return;
    }
    bVar2 = pcVar3[sVar8];
    if (((char)bVar2 < 0x30) ||
       ((sVar10 = -0x30, 0x39 < bVar2 &&
        ((bVar2 < 0x41 ||
         ((sVar10 = -0x37, 0x46 < bVar2 && (sVar10 = -0x57, 5 < (byte)(bVar2 + 0x9f))))))))) break;
    puVar5[lVar6] = puVar5[lVar6] << 4 | sVar10 + (char)bVar2;
    lVar7 = lVar9 + -1;
    lVar9 = lVar7;
    if (lVar7 == 0) {
      lVar9 = 4;
    }
    lVar6 = lVar6 - (ulong)(lVar7 == 0);
    sVar8 = sVar8 + 1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_50,"BN constructor: invalid char \'",&local_99);
  std::operator+(&local_70,&local_50,(str->_M_dataplus)._M_p[sVar8]);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bn,&local_70,
                 "\' in HEX string");
  std::invalid_argument::invalid_argument(this_00,(string *)&bn);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BN::BN(const string &str, RadixBN radix)
{
    if(radix == RadixBN::dec)
    {
        BN bn(1,0);
        for (auto i : str) {
            if (i < '0' || i > '9')
                continue;
            bn.mulbaseappr(10);
            bn += BN(i - '0');
        }
        ba = move(bn.ba);
        return;
    }

    // radix: hex
    size_t length = str.size();
    ba.resize((length + bz * 2 - 1) / (bz * 2));

    size_t index = ba.size() - 1;
    size_t shift = bz * 2 - (ba.size() * bz * 2 - length);

    for (size_t i = 0; i < length; ++i) {
        bt d;
        if (str[i] >= '0' && str[i] <= '9')
            d = str[i] - '0';
        else if (str[i] >= 'A' && str[i] <= 'F')
            d = str[i] - 'A' + 10;
        else if (str[i] >= 'a' && str[i] <= 'f')
            d = str[i] - 'a' + 10;
        else
            throw invalid_argument(string("BN constructor: invalid char '") + str[i] + "' in HEX string");
        ba[index] = (ba[index] << 4) | d;
        --shift;
        if (shift == 0) {
            shift = bz * 2;
            --index;
        }
    }
    Norm(ba);
}